

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionCase::ShaderTextureFunctionCase
          (ShaderTextureFunctionCase *this,TestContext *testCtx,string *name,string *desc,
          TextureLookupSpec *lookup,TextureSpec *texture,TexEvalFunc evalFunc,bool isVertexCase)

{
  TexLookupParams *pTVar1;
  TextureSpec *pTVar2;
  bool bVar3;
  bool bVar4;
  Function FVar5;
  CompareMode CVar6;
  TextureType TVar7;
  TextureType TVar8;
  bool bVar9;
  bool bVar10;
  undefined3 uVar11;
  float fVar12;
  byte bVar13;
  int i;
  DataType DVar14;
  ShaderEvaluator *this_00;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  TextureFormat format;
  char *pcVar18;
  char *pcVar19;
  size_t sVar20;
  size_t sVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  TextureSpec *pTVar25;
  Function FVar26;
  int iVar27;
  ostringstream *this_01;
  GLSLVersion version;
  char *lodBias;
  uint vecSize;
  bool bVar28;
  char *texCoord;
  ostringstream vert;
  ostringstream frag;
  char *local_390;
  char *local_378;
  ostream *local_368;
  long local_340 [14];
  ios_base local_2d0 [264];
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  bVar13 = 0;
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00d5bf70;
  this_00 = (ShaderEvaluator *)operator_new(0x20);
  ShaderEvaluator::ShaderEvaluator(this_00);
  pTVar1 = &this->m_lookupParams;
  this_00->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00d5bfb8;
  this_00[1]._vptr_ShaderEvaluator = (_func_int **)evalFunc;
  this_00[1].m_evalFunc = (ShaderEvalFunc)pTVar1;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,desc,isVertexCase,this_00,
             (UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00d5bf70;
  FVar5 = lookup->function;
  (this->m_lookupSpec).function = FVar5;
  lVar15 = 0;
  do {
    (this->m_lookupSpec).minCoord.m_data[lVar15] = (lookup->minCoord).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  lVar15 = 0;
  do {
    (this->m_lookupSpec).maxCoord.m_data[lVar15] = (lookup->maxCoord).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  (this->m_lookupSpec).maxLodBias = lookup->maxLodBias;
  uVar11 = *(undefined3 *)&lookup->field_0x25;
  fVar12 = lookup->minLodBias;
  (this->m_lookupSpec).useBias = lookup->useBias;
  *(undefined3 *)&(this->m_lookupSpec).field_0x25 = uVar11;
  (this->m_lookupSpec).minLodBias = fVar12;
  lVar15 = 0;
  do {
    (this->m_lookupSpec).minDX.m_data[lVar15] = (lookup->minDX).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  lVar15 = 0;
  do {
    (this->m_lookupSpec).maxDX.m_data[lVar15] = (lookup->maxDX).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  lVar15 = 0;
  do {
    (this->m_lookupSpec).minDY.m_data[lVar15] = (lookup->minDY).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  lVar15 = 0;
  do {
    (this->m_lookupSpec).maxDY.m_data[lVar15] = (lookup->maxDY).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  (this->m_lookupSpec).useOffset = lookup->useOffset;
  lVar15 = 0;
  do {
    (this->m_lookupSpec).offset.m_data[lVar15] = (lookup->offset).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  pTVar2 = &this->m_textureSpec;
  pTVar25 = pTVar2;
  for (lVar15 = 0x15; lVar15 != 0; lVar15 = lVar15 + -1) {
    pTVar25->type = texture->type;
    texture = (TextureSpec *)((long)texture + (ulong)bVar13 * -8 + 4);
    pTVar25 = (TextureSpec *)((long)pTVar25 + (ulong)bVar13 * -8 + 4);
  }
  pTVar1->lod = 0.0;
  (pTVar1->offset).m_data[0] = 0;
  (this->m_lookupParams).offset.m_data[1] = 0;
  (this->m_lookupParams).offset.m_data[2] = 0;
  lVar15 = 0x6d;
  do {
    *(undefined4 *)
     ((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode.
             _vptr_TestNode + lVar15 * 4) = 0x3f800000;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x71);
  (this->m_lookupParams).bias.m_data[0] = 0.0;
  (this->m_lookupParams).bias.m_data[1] = 0.0;
  (this->m_lookupParams).bias.m_data[2] = 0.0;
  (this->m_lookupParams).bias.m_data[3] = 0.0;
  FVar26 = FVar5 & ~FUNCTION_TEXTURELOD;
  CVar6 = (this->m_textureSpec).sampler.compare;
  TVar7 = (this->m_textureSpec).type;
  iVar24 = 1;
  iVar27 = 1;
  if ((CVar6 == COMPAREMODE_NONE && TVar7 == TEXTURETYPE_1D) &&
     (iVar27 = 3, FVar26 != FUNCTION_TEXTUREPROJ)) {
    iVar27 = (uint)(FVar5 == FUNCTION_TEXTUREPROJGRAD) * 2 + 1;
  }
  if (TVar7 != TEXTURETYPE_1D) {
    if ((TVar7 == TEXTURETYPE_2D) || (TVar7 == TEXTURETYPE_1D_ARRAY)) {
      iVar24 = 2;
    }
    else {
      iVar24 = (TVar7 == TEXTURETYPE_CUBE_ARRAY) + 3;
    }
  }
  bVar3 = (this->m_lookupSpec).useBias;
  bVar4 = (this->super_ShaderRenderCase).m_isVertexCase;
  if ((TVar7 == TEXTURETYPE_2D && CVar6 == COMPAREMODE_NONE) &&
      (FVar5 == FUNCTION_TEXTUREPROJGRAD || FVar26 == FUNCTION_TEXTUREPROJ)) {
    iVar27 = 2;
  }
  if (2 < FVar5 - FUNCTION_TEXTUREPROJGRAD && 2 < FVar26 - FUNCTION_TEXTUREPROJ) {
    iVar27 = 0;
  }
  iVar22 = (TVar7 == TEXTURETYPE_1D) + 1;
  bVar28 = CVar6 != COMPAREMODE_NONE;
  if (!bVar28) {
    iVar22 = 0;
  }
  iVar22 = iVar27 + iVar24 + iVar22;
  iVar27 = 4;
  if (TVar7 != TEXTURETYPE_CUBE_ARRAY || !bVar28) {
    iVar27 = iVar22;
  }
  DVar14 = glu::getDataTypeFloatVec(iVar27);
  pcVar16 = glu::getDataTypeName(DVar14);
  pcVar17 = glu::getPrecisionName(PRECISION_HIGHP);
  format = glu::mapGLInternalFormat((this->m_textureSpec).format);
  TVar8 = pTVar2->type;
  if (((ulong)TVar8 < 5) && ((0x1dU >> (TVar8 & 0x1f) & 1) != 0)) {
    DVar14 = *(DataType *)(&DAT_00b52f48 + (ulong)TVar8 * 4);
  }
  else {
    DVar14 = TVar8 == TEXTURETYPE_CUBE_ARRAY | TYPE_FLOAT_VEC2;
  }
  pcVar18 = glu::getDataTypeName(DVar14);
  switch(pTVar2->type) {
  case TEXTURETYPE_1D:
    DVar14 = TYPE_SAMPLER_1D_SHADOW;
    if (CVar6 == COMPAREMODE_NONE) {
      DVar14 = glu::getSampler1DType(format);
    }
    break;
  case TEXTURETYPE_2D:
    DVar14 = TYPE_SAMPLER_2D_SHADOW;
    if (CVar6 == COMPAREMODE_NONE) {
      DVar14 = glu::getSampler2DType(format);
    }
    break;
  case TEXTURETYPE_3D:
    DVar14 = glu::getSampler3DType(format);
    break;
  case TEXTURETYPE_CUBE_MAP:
    DVar14 = TYPE_SAMPLER_CUBE_SHADOW;
    if (CVar6 == COMPAREMODE_NONE) {
      DVar14 = glu::getSamplerCubeType(format);
    }
    break;
  case TEXTURETYPE_1D_ARRAY:
    DVar14 = TYPE_SAMPLER_1D_ARRAY_SHADOW;
    if (CVar6 == COMPAREMODE_NONE) {
      DVar14 = glu::getSampler1DArrayType(format);
    }
    break;
  case TEXTURETYPE_2D_ARRAY:
    DVar14 = TYPE_SAMPLER_2D_ARRAY_SHADOW;
    if (CVar6 == COMPAREMODE_NONE) {
      DVar14 = glu::getSampler2DArrayType(format);
    }
    break;
  case TEXTURETYPE_CUBE_ARRAY:
    DVar14 = TYPE_SAMPLER_CUBE_ARRAY_SHADOW;
    if (CVar6 == COMPAREMODE_NONE) {
      DVar14 = glu::getSamplerCubeArrayType(format);
    }
    break;
  default:
    DVar14 = TYPE_LAST;
  }
  switch((this->m_lookupSpec).function) {
  case FUNCTION_TEXTURE:
    local_390 = "texture";
    break;
  case FUNCTION_TEXTUREPROJ:
  case FUNCTION_TEXTUREPROJ2:
  case FUNCTION_TEXTUREPROJ3:
    local_390 = "textureProj";
    break;
  case FUNCTION_TEXTURELOD:
    local_390 = "textureLod";
    break;
  case FUNCTION_TEXTUREPROJLOD:
  case FUNCTION_TEXTUREPROJLOD2:
  case FUNCTION_TEXTUREPROJLOD3:
    local_390 = "textureProjLod";
    break;
  case FUNCTION_TEXTUREGRAD:
    local_390 = "textureGrad";
    break;
  case FUNCTION_TEXTUREPROJGRAD:
  case FUNCTION_TEXTUREPROJGRAD2:
  case FUNCTION_TEXTUREPROJGRAD3:
    local_390 = "textureProjGrad";
    break;
  case FUNCTION_TEXELFETCH:
    local_390 = "texelFetch";
    break;
  default:
    bVar10 = true;
    local_390 = (char *)0x0;
    goto LAB_00650b44;
  }
  bVar10 = false;
LAB_00650b44:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  this_01 = (ostringstream *)local_1a8;
  if (bVar4 != false) {
    this_01 = (ostringstream *)local_340;
  }
  if (pTVar2->type < TEXTURETYPE_LAST) {
    if ((0x2eU >> (pTVar2->type & 0x1f) & 1) == 0) {
      version = GLSL_VERSION_420;
      goto LAB_00650b9c;
    }
    version = GLSL_VERSION_310_ES;
    bVar9 = true;
  }
  else {
    version = GLSL_VERSION_LAST;
LAB_00650b9c:
    bVar9 = false;
  }
  pcVar19 = glu::getGLSLVersionDeclaration(version);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                    0x78);
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"layout(location = 4) in ",0x18);
  if (pcVar17 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                    0x78);
  }
  else {
    sVar20 = strlen(pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                    0x78);
  }
  else {
    sVar20 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar16,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," a_in0;\n",8);
  bVar13 = FVar5 < FUNCTION_LAST & (byte)(0x10f0 >> ((byte)FVar5 & 0x1f));
  FVar26 = FVar5 & ~FUNCTION_TEXTUREPROJ3;
  if (FVar26 == FUNCTION_TEXTUREGRAD) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 5) in ",0x18);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar18,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," a_in1;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 6) in ",0x18);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar18,sVar20);
    }
    lVar15 = 8;
    pcVar19 = " a_in2;\n";
LAB_00650ed1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar19,lVar15);
  }
  else if (bVar13 != 0 || (bVar3 & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 5) in ",0x18);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
    }
    lVar15 = 0xe;
    pcVar19 = " float a_in1;\n";
    goto LAB_00650ed1;
  }
  pcVar19 = glu::getGLSLVersionDeclaration(version);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                    0x210);
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if (bVar4 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 0) out ",0x19);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
    if (pcVar16 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                      0x78);
    }
    else {
      sVar20 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar16,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," v_texCoord;\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in ",0x18);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                      0x210);
    }
    else {
      sVar20 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar17,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    if (pcVar16 == (char *)0x0) {
      std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                      0x210);
    }
    else {
      sVar20 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar16,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_texCoord;\n",0xd);
    if (FVar26 == FUNCTION_TEXTUREGRAD) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"layout(location = 1) out ",0x19);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x78);
      }
      else {
        sVar20 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x78);
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar18,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," v_gradX;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"layout(location = 2) out ",0x19);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x78);
      }
      else {
        sVar20 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," ",1);
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x78);
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar18,sVar20);
      }
      pcVar16 = " v_gradY;\n";
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340," v_gradY;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 1) in ",0x18);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x210);
      }
      else {
        sVar20 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar17,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      if (pcVar18 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x210);
      }
      else {
        sVar20 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_gradX;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 2) in ",0x18);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x210);
      }
      else {
        sVar20 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar17,sVar20);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      if (pcVar18 == (char *)0x0) {
        lVar15 = 10;
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x210);
      }
      else {
        sVar20 = strlen(pcVar18);
        lVar15 = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,sVar20);
      }
      goto LAB_00651534;
    }
    if (bVar13 != 0 || (bVar3 & 1U) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"layout(location = 1) out ",0x19);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_340[0] + -0x18) +
                        0x78);
      }
      else {
        sVar20 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar17,sVar20);
      }
      pcVar16 = " float v_lodBias;\n";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340," float v_lodBias;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = 1) in ",0x18);
      if (pcVar17 == (char *)0x0) {
        lVar15 = 0x12;
        std::ios::clear((int)&stack0xfffffffffffffc48 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                        0x210);
      }
      else {
        sVar20 = strlen(pcVar17);
        lVar15 = 0x12;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar17,sVar20);
      }
      goto LAB_00651534;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
    lVar15 = 0x2e;
    pcVar16 = "layout(location = 0) in mediump vec4 v_color;\n";
LAB_00651534:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar16,lVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"layout(set = 0, binding = 0) uniform highp ",0x2b);
  pcVar16 = glu::getDataTypeName(DVar14);
  iVar27 = (int)this_01;
  if (pcVar16 == (char *)0x0) {
    std::ios::clear(iVar27 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
  }
  else {
    sVar20 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar16,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," u_sampler;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,
             "layout(set = 0, binding = 1) uniform buf0 { highp vec4 u_scale; };\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,
             "layout(set = 0, binding = 2) uniform buf1 { highp vec4 u_bias; };\n",0x42);
  if (!bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"out gl_PerVertex {\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_340,"\tvec4 gl_Position;\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"};\n",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\nvoid main()\n{\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"\tgl_Position = a_position;\n",0x1b);
  local_368 = (ostream *)local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(local_368,"\nvoid main()\n{\n",0xf);
  if (bVar4 == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\to_color = ",0xb);
    local_378 = "v_texCoord";
    pcVar16 = "v_gradX";
    pcVar18 = "v_gradY";
    pcVar17 = "v_lodBias";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"\tv_color = ",0xb);
    local_378 = "a_in0";
    pcVar18 = "a_in2";
    pcVar17 = "a_in1";
    pcVar16 = "a_in1";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"vec4(",5);
  if (bVar10) {
    std::ios::clear(iVar27 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
  }
  else {
    sVar20 = strlen(local_390);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_390,sVar20);
  }
  if ((this->m_lookupSpec).useOffset == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Offset",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(u_sampler, ",0xc);
  if (FVar5 == FUNCTION_TEXELFETCH) {
    DVar14 = glu::getDataTypeIntVec(iVar22);
    pcVar19 = glu::getDataTypeName(DVar14);
    if (pcVar19 == (char *)0x0) {
      std::ios::clear(iVar27 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar20 = strlen(pcVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar19,sVar20);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(",1);
  }
  sVar20 = strlen(local_378);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_378,sVar20);
  if (FVar5 == FUNCTION_TEXELFETCH) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
  }
  if (FVar26 == FUNCTION_TEXTUREGRAD) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    sVar21 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar16,sVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    sVar21 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,sVar21);
  }
  if ((FVar5 - FUNCTION_TEXTURELOD < 4) || (FVar5 == FUNCTION_TEXELFETCH)) {
    if (FVar5 == FUNCTION_TEXELFETCH) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", int(",6);
      sVar21 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar17,sVar21);
      sVar21 = 1;
      pcVar16 = ")";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
      sVar21 = strlen(pcVar17);
      pcVar16 = pcVar17;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar16,sVar21);
  }
  if ((this->m_lookupSpec).useOffset == true) {
    vecSize = 1;
    if ((pTVar2->type & ~TEXTURETYPE_1D_ARRAY) != TEXTURETYPE_1D) {
      vecSize = pTVar2->type == TEXTURETYPE_3D | 2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    DVar14 = glu::getDataTypeIntVec(vecSize);
    pcVar16 = glu::getDataTypeName(DVar14);
    if (pcVar16 == (char *)0x0) {
      std::ios::clear(iVar27 + (int)*(undefined8 *)(*(long *)this_01 + -0x18));
    }
    else {
      sVar21 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar16,sVar21);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(",1);
    uVar23 = 0;
    do {
      if (uVar23 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
      }
      std::ostream::operator<<(this_01,(this->m_lookupSpec).offset.m_data[uVar23]);
      uVar23 = uVar23 + 1;
    } while (vecSize != uVar23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
  }
  if ((TVar7 == TEXTURETYPE_CUBE_ARRAY && bVar28) &&
      (this->m_lookupSpec).function == FUNCTION_TEXTURE) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_378,sVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,".w",2);
  }
  if ((this->m_lookupSpec).useBias == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", ",2);
    sVar20 = strlen(pcVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar17,sVar20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")",1);
  pcVar16 = ", 0.0, 0.0, 1.0)";
  if (CVar6 == COMPAREMODE_NONE) {
    pcVar16 = ")*u_scale + u_bias";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,pcVar16,(ulong)(CVar6 == COMPAREMODE_NONE) * 2 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  lVar15 = 0x14;
  if (bVar4 == false) {
    local_368 = (ostream *)local_340;
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\tv_texCoord = a_in0;\n",0x15);
    if (FVar26 == FUNCTION_TEXTUREGRAD) {
      lVar15 = 0x12;
      local_368 = (ostream *)local_340;
      std::__ostream_insert<char,std::char_traits<char>>(local_368,"\tv_gradX = a_in1;\n",0x12);
      pcVar16 = "\tv_gradY = a_in2;\n";
    }
    else {
      if (bVar13 == 0 && (bVar3 & 1U) == 0) goto LAB_00651b19;
      pcVar16 = "\tv_lodBias = a_in1;\n";
    }
  }
  else {
    pcVar16 = "\to_color = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_368,pcVar16,lVar15);
LAB_00651b19:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  std::ios_base::~ios_base(local_2d0);
  return;
}

Assistant:

ShaderTextureFunctionCase::ShaderTextureFunctionCase (tcu::TestContext&				testCtx,
													  const std::string&			name,
													  const std::string&			desc,
													  const TextureLookupSpec&		lookup,
													  const TextureSpec&			texture,
													  TexEvalFunc					evalFunc,
													  bool							isVertexCase)
	: ShaderRenderCase		(testCtx, name, desc, isVertexCase, new TexLookupEvaluator(evalFunc, m_lookupParams), NULL, NULL)
	, m_lookupSpec			(lookup)
	, m_textureSpec			(texture)
{
	initShaderSources();
}